

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O2

void google::protobuf::internal::PackedFieldHelper<6>::
     Serialize<google::protobuf::internal::ArrayOutput>
               (void *field,FieldMetadata *md,ArrayOutput *output)

{
  uint8 *puVar1;
  int i;
  long lVar2;
  RepeatedField<unsigned_long> *array;
  
  if (*field != 0) {
    WriteTagTo<google::protobuf::internal::ArrayOutput>(md->tag,output);
    WriteLengthTo<google::protobuf::internal::ArrayOutput>(*(uint32 *)((long)field + 0x10),output);
    for (lVar2 = 0; lVar2 < *field; lVar2 = lVar2 + 1) {
      puVar1 = output->ptr;
      *(undefined8 *)puVar1 = *(undefined8 *)(*(long *)((long)field + 8) + lVar2 * 8);
      output->ptr = puVar1 + 8;
    }
  }
  return;
}

Assistant:

inline bool RepeatedField<Element>::empty() const {
  return current_size_ == 0;
}